

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecPo.c
# Opt level: O2

Vec_Wec_t * Acec_ParseSignature(char *p)

{
  char *pcVar1;
  Vec_Wec_t *pVVar2;
  char *pStop;
  size_t sVar3;
  Vec_Wec_t *vM2;
  Vec_Wec_t *pVVar4;
  Vec_Wec_t *pVVar5;
  long lVar6;
  
  if (*p != '(') {
    sVar3 = strlen(p);
    lVar6 = sVar3 << 0x20;
    pcVar1 = (char *)malloc(lVar6 + 0x300000000 >> 0x20);
    *pcVar1 = '(';
    strcpy(pcVar1 + 1,p);
    pcVar1[lVar6 + 0x100000000 >> 0x20] = ')';
    pcVar1[lVar6 + 0x200000000 >> 0x20] = '\0';
    pVVar2 = Acec_ParseSignatureOne(pcVar1,pcVar1 + (long)(int)sVar3 + 1);
    free(pcVar1);
    return pVVar2;
  }
  pcVar1 = strchr(p,0x29);
  if (pcVar1 != (char *)0x0) {
    pVVar2 = Acec_ParseSignatureOne(p,pcVar1);
    if (pcVar1[1] == '\0') {
      return pVVar2;
    }
    if (pcVar1[1] != '*') {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecPo.c"
                    ,0x9b,"Vec_Wec_t *Acec_ParseSignature(char *)");
    }
    pStop = strchr(pcVar1 + 2,0x29);
    if (pStop != (char *)0x0 && pcVar1[2] == '(') {
      vM2 = Acec_ParseSignatureOne(pcVar1 + 2,pStop);
      if (pStop[1] != '+') {
        if (pStop[1] == '\0') {
          pVVar4 = Acec_ParseDistribute(pVVar2,vM2,(Vec_Wec_t *)0x0);
          Vec_WecFree(pVVar2);
          Vec_WecFree(vM2);
          return pVVar4;
        }
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecPo.c"
                      ,0x99,"Vec_Wec_t *Acec_ParseSignature(char *)");
      }
      pcVar1 = strchr(pStop + 2,0x29);
      if (pcVar1 != (char *)0x0 && pStop[2] == '(') {
        pVVar4 = Acec_ParseSignatureOne(pStop + 2,pcVar1);
        pVVar5 = Acec_ParseDistribute(pVVar2,vM2,pVVar4);
        Vec_WecFree(pVVar2);
        Vec_WecFree(vM2);
        Vec_WecFree(pVVar4);
        return pVVar5;
      }
    }
  }
  return (Vec_Wec_t *)0x0;
}

Assistant:

Vec_Wec_t * Acec_ParseSignature( char * p )
{
    Vec_Wec_t * vAdd = NULL, * vTemp1, * vTemp2, * vRes;
    if ( p[0] == '(' )
    {
        char * pStop = strstr(p, ")");
        if ( pStop == NULL )
            return NULL;
        vTemp1 = Acec_ParseSignatureOne( p, pStop );
        if ( pStop[1] == 0 )
            return vTemp1;
        if ( pStop[1] == '*' )
        {
            char * p2 = pStop + 2;
            char * pStop2 = strstr(p2, ")");
            if ( p2[0] != '(' )
                return NULL;
            if ( pStop2 == NULL )
                return NULL;
            vTemp2 = Acec_ParseSignatureOne( p2, pStop2 );
            if ( pStop2[1] == 0 )
            {
                vRes = Acec_ParseDistribute( vTemp1, vTemp2, vAdd );
                Vec_WecFree( vTemp1 );
                Vec_WecFree( vTemp2 );
                return vRes;
            }
            if ( pStop2[1] == '+' )
            {
                char * p3 = pStop2 + 2;
                char * pStop3 = strstr(p3, ")");
                if ( p3[0] != '(' )
                    return NULL;
                if ( pStop3 == NULL )
                    return NULL;
                vAdd = Acec_ParseSignatureOne( p3, pStop3 );
                vRes = Acec_ParseDistribute( vTemp1, vTemp2, vAdd );
                Vec_WecFree( vTemp1 );
                Vec_WecFree( vTemp2 );
                Vec_WecFree( vAdd );
                return vRes;
            }
            assert( 0 );
        }
        assert( 0 );
    }
    else
    {
        int Len = strlen(p);
        char * pCopy = ABC_ALLOC( char, Len+3 );
        pCopy[0] = '(';
        strcpy( pCopy+1, p );
        pCopy[Len+1] = ')';
        pCopy[Len+2] = '\0';
        vRes = Acec_ParseSignatureOne( pCopy, pCopy + Len + 1 );
        ABC_FREE( pCopy );
        return vRes;
    }
    return NULL;
}